

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheVk::AssignDescriptorSetAllocation
          (ShaderResourceCacheVk *this,Uint32 SetIndex,DescriptorSetAllocation *Allocation)

{
  bool bVar1;
  Uint32 UVar2;
  Char *pCVar3;
  undefined1 local_78 [8];
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  DescriptorSet *DescrSet;
  DescriptorSetAllocation *Allocation_local;
  Uint32 SetIndex_local;
  ShaderResourceCacheVk *this_local;
  
  msg.field_2._8_8_ = GetDescriptorSet(this,SetIndex);
  UVar2 = DescriptorSet::GetSize((DescriptorSet *)msg.field_2._8_8_);
  if (UVar2 == 0) {
    FormatString<char[24]>((string *)local_48,(char (*) [24])"Descriptor set is empty");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AssignDescriptorSetAllocation",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0xc6);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = DescriptorSetAllocation::operator_cast_to_bool
                    ((DescriptorSetAllocation *)(msg.field_2._8_8_ + 0x10));
  if (bVar1) {
    FormatString<char[55]>
              ((string *)local_78,
               (char (*) [55])"Descriptor set allocation has already been initialized");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AssignDescriptorSetAllocation",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,199);
    std::__cxx11::string::~string((string *)local_78);
  }
  DescriptorSetAllocation::operator=
            ((DescriptorSetAllocation *)(msg.field_2._8_8_ + 0x10),Allocation);
  return;
}

Assistant:

void AssignDescriptorSetAllocation(Uint32 SetIndex, DescriptorSetAllocation&& Allocation)
    {
        DescriptorSet& DescrSet = GetDescriptorSet(SetIndex);
        VERIFY(DescrSet.GetSize() > 0, "Descriptor set is empty");
        VERIFY(!DescrSet.m_DescriptorSetAllocation, "Descriptor set allocation has already been initialized");
        DescrSet.m_DescriptorSetAllocation = std::move(Allocation);
    }